

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O0

void __thiscall slang::ast::Scope::elaborate(Scope *this)

{
  string_view *psVar1;
  SyntaxKind SVar2;
  Compilation *pCVar3;
  ForwardingTypedefSymbol *pFVar4;
  span<slang::ast::Symbol_*const,_18446744073709551615UL> deferredMembers;
  bool bVar5;
  bool bVar6;
  SymbolIndex scopeIndex;
  DeferredMemberData *pDVar9;
  SyntaxNode *pSVar10;
  EnumType *this_00;
  EnumValueSymbol *args;
  TransparentMemberSymbol *member_00;
  EnumTypeSyntax *syntax_00;
  iterator ppSVar11;
  ClassType *pCVar12;
  Definition *pDVar13;
  iterator ppSVar14;
  DeferredMemberSymbol *pDVar15;
  HierarchyInstantiationSyntax *syntax_01;
  PrimitiveInstantiationSyntax *syntax_02;
  IfGenerateSyntax *syntax_03;
  CaseGenerateSyntax *syntax_04;
  LoopGenerateSyntax *syntax_05;
  GenerateBlockArraySymbol *member_01;
  GenerateBlockSyntax *syntax_06;
  GenerateBlockSymbol *member_02;
  PortSymbol *this_01;
  bool bVar7;
  int iVar8;
  Symbol *this_02;
  InstanceBodySymbol *pIVar16;
  undefined4 extraout_var;
  ContinuousAssignSyntax *syntax_07;
  ModportDeclarationSyntax *syntax_08;
  BindDirectiveSyntax *syntax_09;
  ClockingItemSyntax *syntax_10;
  DefaultClockingReferenceSyntax *syntax_11;
  DefaultDisableDeclarationSyntax *pDVar17;
  ExpressionSyntax *pEVar18;
  undefined4 extraout_var_00;
  Type *this_03;
  DataDeclarationSyntax *pDVar19;
  logic_error *this_04;
  ModuleDeclarationSyntax *syntax_12;
  type *ppSVar20;
  PortDeclarationSyntax *pPVar21;
  Diagnostic *pDVar22;
  iterator ppFVar23;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*> *ppVar24;
  TypeAliasType *this_05;
  GenericClassDefSymbol *this_06;
  StatementBlockSymbol *this_07;
  EVP_PKEY_CTX *src;
  LookupLocation lookupLocation;
  span<const_std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_18446744073709551615UL>
  sVar25;
  pair<ska::detailv3::sherwood_v3_table<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::SyntaxNode_*,_std::hash<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>::templated_iterator<const_slang::syntax::SyntaxNode_*>,_bool>
  pVar26;
  iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>_> iVar27;
  span<slang::ast::Symbol_*const,_18446744073709551615UL> sVar28;
  LookupLocation LVar29;
  span<const_std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_18446744073709551615UL>
  sVar30;
  const_iterator cVar31;
  string_view sVar32;
  SourceRange sourceRange;
  span<const_slang::ast::ForwardingTypedefSymbol_*const,_18446744073709551615UL> sVar33;
  pair<ska::detailv3::sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>_>::templated_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>,_bool>
  pVar34;
  undefined1 in_stack_fffffffffffff248 [15];
  undefined1 in_stack_fffffffffffff257;
  byte local_d21;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *local_cb0;
  byte local_aa1;
  anon_class_16_2_e8807fae local_a60;
  function_ref<void_(const_slang::ast::Symbol_&)> local_a50;
  Symbol *local_a40;
  Symbol *at;
  char *pcStack_a30;
  SourceLocation local_a28;
  undefined4 local_a1c;
  templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
  local_a18;
  templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
  local_a10;
  iterator it;
  ForwardingTypedefSymbol *symbol_4;
  iterator __end2_2;
  iterator __begin2_2;
  size_type local_9c8;
  span<const_slang::ast::ForwardingTypedefSymbol_*const,_18446744073709551615UL> *local_9c0;
  span<const_slang::ast::ForwardingTypedefSymbol_*const,_18446744073709551615UL> *__range2_2;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_4UL,_ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>_>
  observedForwardDecls;
  Symbol *prev;
  Symbol *symbol_3;
  undefined1 auStack_8f0 [8];
  string_view name;
  DeclaratorSyntax *decl;
  const_iterator __end4_2;
  const_iterator __begin4_2;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *__range4_2;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *declarators;
  type *symbol_2;
  type *syntax_1;
  Symbol *local_890;
  iterator local_888;
  iterator __end3_1;
  iterator __begin3_1;
  size_type local_870;
  span<const_std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_18446744073709551615UL>
  *local_868;
  span<const_std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_18446744073709551615UL>
  *__range3_1;
  DeferredMemberSymbol *member_2;
  Symbol *symbol_1;
  iterator __end3;
  iterator __begin3;
  span<slang::ast::Symbol_*const,_18446744073709551615UL> *__range3;
  string local_830;
  allocator<char> local_809;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_808;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  undefined1 local_768 [8];
  SmallVector<const_slang::ast::Symbol_*,_5UL> instances_2;
  Expression *expr;
  SmallVector<const_slang::ast::ClockVarSymbol_*,_5UL> vars;
  SmallVector<const_slang::ast::ModportSymbol_*,_5UL> results;
  SmallVector<const_slang::ast::Symbol_*,_5UL> implicitNets_2;
  SmallVector<const_slang::ast::Symbol_*,_5UL> symbols;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> local_608;
  type *local_5f8;
  type *insertionPoint;
  type *implicitMember;
  Symbol *pSStack_5e0;
  iterator local_5d8;
  iterator __end4_1;
  iterator __begin4_1;
  SmallVector<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_4UL> *__range4_1;
  size_type local_5b8;
  undefined1 local_5b0 [8];
  SmallVector<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_4UL> implicitMembers;
  SmallVector<const_slang::ast::Symbol_*,_5UL> ports;
  SmallVector<slang::ast::GenerateBlockSymbol_*,_5UL> blocks_1;
  SmallVector<slang::ast::GenerateBlockSymbol_*,_5UL> blocks;
  SmallVector<const_slang::ast::Symbol_*,_5UL> implicitNets_1;
  SmallVector<const_slang::ast::Symbol_*,_5UL> instances_1;
  SmallVector<const_slang::ast::Symbol_*,_5UL> implicitNets;
  SmallVector<const_slang::ast::Symbol_*,_5UL> instances;
  DeferredMemberSymbol *member_1;
  Scope *local_388;
  uint32_t local_380;
  Scope *local_378;
  uint32_t local_370;
  undefined1 local_368 [8];
  ASTContext context_1;
  Symbol *symbol;
  iterator __end2_1;
  iterator __begin2_1;
  span<slang::ast::Symbol_*const,_18446744073709551615UL> *__range2_1;
  uint32_t constructIndex;
  bool hasNestedDefs;
  bool usedPorts;
  anon_class_8_1_8991fb9c insertMembersAndNets;
  anon_class_8_1_8991fb9c insertMembers;
  anon_class_8_1_8991fb9c local_2e8;
  function_ref<void_(const_slang::ast::Symbol_&)> local_2e0;
  undefined1 auStack_2d0 [8];
  span<slang::ast::Symbol_*const,_18446744073709551615UL> deferred;
  Symbol *member;
  iterator __end4;
  iterator __begin4;
  SmallVector<const_slang::ast::Symbol_*,_5UL> *__range4;
  undefined8 local_298;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  undefined1 local_280 [8];
  ASTContext context;
  SmallVector<const_slang::ast::Symbol_*,_5UL> members;
  DataTypeSyntax *syntax;
  TransparentMemberSymbol *wrapped;
  EnumValueSymbol *value;
  specific_symbol_iterator<slang::ast::EnumValueSymbol> __end5;
  specific_symbol_iterator<slang::ast::EnumValueSymbol> __begin5;
  iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>_>
  *__range5;
  SyntaxNode *local_1b8;
  EntryPointer local_1b0;
  undefined1 local_1a8;
  Type *local_1a0;
  Type *type;
  DeclaredType *dt;
  Symbol *insertAt;
  pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*> *pair;
  iterator __end2;
  iterator __begin2;
  size_type local_168;
  span<const_std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_18446744073709551615UL>
  *local_160;
  span<const_std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_18446744073709551615UL>
  *__range2;
  undefined1 local_148 [8];
  SmallSet<const_slang::syntax::SyntaxNode_*,_8UL,_ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
  enumDecls;
  DeferredMemberData deferredData;
  function_ref<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_30;
  string_view local_20;
  Scope *local_10;
  Scope *this_local;
  Expression *expr_00;
  
  local_10 = this;
  if ((this->thisSym->kind == InstanceBody) && (bVar6 = TimeTrace::isEnabled(), bVar6)) {
    local_20 = sv("elaborate scope",0xf);
    deferredData.portDecls.
    super__Vector_base<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
    function_ref<std::__cxx11::string()>::function_ref<slang::ast::Scope::elaborate()const::__2>
              ((function_ref<std::__cxx11::string()> *)&local_30,
               (anon_class_8_1_8991fb9c *)
               &deferredData.portDecls.
                super__Vector_base<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (enable_if_t<_std::is_same<std::remove_cv_t<std::remove_reference_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Kuree[P]hgdb_rtl_extern_slang_source_ast_Scope_cpp:799:52)>_>,_function_ref<basic_string<char>_()>_>::value>
                *)0x0);
    TimeTrace::beginTrace(local_20,local_30);
  }
  if (this->deferredMemberIndex == Invalid) {
    assert::assertFailed
              ("deferredMemberIndex != DeferredMemberIndex::Invalid",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Scope.cpp"
               ,0x326,"void slang::ast::Scope::elaborate() const");
  }
  pDVar9 = Compilation::getOrAddDeferredData(this->compilation,&this->deferredMemberIndex);
  DeferredMemberData::DeferredMemberData
            ((DeferredMemberData *)
             &enumDecls.
              super_flat_hash_set<const_slang::syntax::SyntaxNode_*,_std::hash<const_SyntaxNode_*>,_std::equal_to<const_SyntaxNode_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
              .
              super_sherwood_v3_table<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::SyntaxNode_*,_std::hash<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
              .num_elements,pDVar9);
  this->deferredMemberIndex = Invalid;
  SmallSet<const_slang::syntax::SyntaxNode_*,_8UL,_ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
  ::SmallSet((SmallSet<const_slang::syntax::SyntaxNode_*,_8UL,_ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
              *)local_148);
  sVar25 = DeferredMemberData::getTransparentTypes
                     ((DeferredMemberData *)
                      &enumDecls.
                       super_flat_hash_set<const_slang::syntax::SyntaxNode_*,_std::hash<const_SyntaxNode_*>,_std::equal_to<const_SyntaxNode_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
                       .
                       super_sherwood_v3_table<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::SyntaxNode_*,_std::hash<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
                       .num_elements);
  local_168 = sVar25.size_;
  __begin2 = sVar25.data_;
  local_160 = (span<const_std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_18446744073709551615UL>
               *)&__begin2;
  __end2 = nonstd::span_lite::
           span<const_std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_18446744073709551615UL>
           ::begin(local_160);
  pair = nonstd::span_lite::
         span<const_std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_18446744073709551615UL>
         ::end(local_160);
  for (; __end2 != pair; __end2 = __end2 + 1) {
    insertAt = (Symbol *)__end2;
    dt = (DeclaredType *)__end2->first;
    type = (Type *)Symbol::getDeclaredType(__end2->second);
    local_1a0 = DeclaredType::getType((DeclaredType *)type);
    while (bVar6 = Type::isPackedArray(local_1a0), bVar6) {
      local_1a0 = Type::getArrayElementType(local_1a0);
    }
    if ((local_1a0->super_Symbol).kind == EnumType) {
      pSVar10 = Symbol::getSyntax(&local_1a0->super_Symbol);
      local_aa1 = 1;
      if (pSVar10 != (SyntaxNode *)0x0) {
        local_1b8 = Symbol::getSyntax(&local_1a0->super_Symbol);
        pVar26 = ska::detailv3::
                 sherwood_v3_table<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::SyntaxNode_*,_std::hash<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
                 ::insert((sherwood_v3_table<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::SyntaxNode_*,_std::hash<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
                           *)&enumDecls.
                              super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>
                              .ptr,&local_1b8);
        local_1b0 = (EntryPointer)pVar26.first.current;
        local_aa1 = pVar26.second;
        local_1a8 = local_aa1;
      }
      if ((local_aa1 & 1) != 0) {
        this_00 = Symbol::as<slang::ast::EnumType>(&local_1a0->super_Symbol);
        iVar27 = EnumType::values(this_00);
        __begin5 = iVar27.m_begin.current;
        __end5 = iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>_>
                 ::begin((iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>_>
                          *)&__begin5);
        value = (EnumValueSymbol *)
                iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>_>
                ::end((iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>_>
                       *)&__begin5);
        while (bVar6 = iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_std::forward_iterator_tag,_const_slang::ast::EnumValueSymbol,_long,_const_slang::ast::EnumValueSymbol_*,_const_slang::ast::EnumValueSymbol_&>
                       ::operator!=((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_std::forward_iterator_tag,_const_slang::ast::EnumValueSymbol,_long,_const_slang::ast::EnumValueSymbol_*,_const_slang::ast::EnumValueSymbol_&>
                                     *)&__end5,
                                    (specific_symbol_iterator<slang::ast::EnumValueSymbol> *)&value)
              , bVar6) {
          args = specific_symbol_iterator<slang::ast::EnumValueSymbol>::operator*(&__end5);
          member_00 = BumpAllocator::
                      emplace<slang::ast::TransparentMemberSymbol,slang::ast::EnumValueSymbol_const&>
                                (&this->compilation->super_BumpAllocator,args);
          insertMember(this,&member_00->super_Symbol,(Symbol *)dt,true,false);
          dt = (DeclaredType *)member_00;
          specific_symbol_iterator<slang::ast::EnumValueSymbol>::operator++(&__end5);
        }
      }
    }
    else {
      pSVar10 = (SyntaxNode *)DeclaredType::getTypeSyntax((DeclaredType *)type);
      if (pSVar10 == (SyntaxNode *)0x0) {
        assert::assertFailed
                  ("syntax",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Scope.cpp"
                   ,0x341,"void slang::ast::Scope::elaborate() const");
      }
      if ((local_1a0->super_Symbol).kind != ErrorType) {
        assert::assertFailed
                  ("type->kind == SymbolKind::ErrorType",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Scope.cpp"
                   ,0x342,"void slang::ast::Scope::elaborate() const");
      }
      SmallVector<const_slang::ast::Symbol_*,_5UL>::SmallVector
                ((SmallVector<const_slang::ast::Symbol_*,_5UL> *)&context.assertionInstance);
      local_298 = LookupLocation::max;
      uStack_290 = (undefined4)DAT_0091b918;
      uStack_28c = (undefined4)((ulong)DAT_0091b918 >> 0x20);
      bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&__range4,None);
      LVar29.index = uStack_290;
      LVar29.scope = (Scope *)local_298;
      LVar29._12_4_ = 0;
      ASTContext::ASTContext
                ((ASTContext *)local_280,this,LVar29,(bitmask<slang::ast::ASTFlags>)__range4);
      syntax_00 = slang::syntax::SyntaxNode::as<slang::syntax::EnumTypeSyntax>(pSVar10);
      EnumType::createDefaultMembers
                ((ASTContext *)local_280,syntax_00,
                 (SmallVectorBase<const_slang::ast::Symbol_*> *)&context.assertionInstance);
      __end4 = SmallVectorBase<const_slang::ast::Symbol_*>::begin
                         ((SmallVectorBase<const_slang::ast::Symbol_*> *)&context.assertionInstance)
      ;
      ppSVar11 = SmallVectorBase<const_slang::ast::Symbol_*>::end
                           ((SmallVectorBase<const_slang::ast::Symbol_*> *)
                            &context.assertionInstance);
      for (; __end4 != ppSVar11; __end4 = __end4 + 1) {
        deferred.size_ = (size_type)*__end4;
        insertMember(this,(Symbol *)deferred.size_,(Symbol *)dt,true,false);
        dt = (DeclaredType *)deferred.size_;
      }
      SmallVector<const_slang::ast::Symbol_*,_5UL>::~SmallVector
                ((SmallVector<const_slang::ast::Symbol_*,_5UL> *)&context.assertionInstance);
    }
  }
  sVar28 = DeferredMemberData::getMembers
                     ((DeferredMemberData *)
                      &enumDecls.
                       super_flat_hash_set<const_slang::syntax::SyntaxNode_*,_std::hash<const_SyntaxNode_*>,_std::equal_to<const_SyntaxNode_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
                       .
                       super_sherwood_v3_table<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::SyntaxNode_*,_std::hash<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
                       .num_elements);
  deferred.data_ = (pointer)sVar28.size_;
  auStack_2d0 = (undefined1  [8])sVar28.data_;
  if (this->thisSym->kind == ClassType) {
    pCVar12 = Symbol::as<slang::ast::ClassType>(this->thisSym);
    local_2e8.this = this;
    function_ref<void(slang::ast::Symbol_const&)>::
    function_ref<slang::ast::Scope::elaborate()const::__3>
              ((function_ref<void(slang::ast::Symbol_const&)> *)&local_2e0,&local_2e8,
               (enable_if_t<_std::is_same<std::remove_cv_t<std::remove_reference_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Kuree[P]hgdb_rtl_extern_slang_source_ast_Scope_cpp:852:13)>_>,_function_ref<void_(const_Symbol_&)>_>::value>
                *)0x0);
    ClassType::inheritMembers(pCVar12,local_2e0);
    sVar28.size_ = (size_type)deferred.data_;
    sVar28.data_ = (pointer)auStack_2d0;
  }
  else if (this->thisSym->kind == InstanceBody) {
    pIVar16 = Symbol::as<slang::ast::InstanceBodySymbol>(this->thisSym);
    pDVar13 = InstanceBodySymbol::getDefinition(pIVar16);
    sVar28.size_ = (size_type)deferred.data_;
    sVar28.data_ = (pointer)auStack_2d0;
    if (pDVar13->definitionKind == Interface) {
      deferredMembers.size_ = (size_type)deferred.data_;
      deferredMembers.data_ = (pointer)auStack_2d0;
      handleExportedMethods(this,deferredMembers);
      sVar28.size_ = (size_type)deferred.data_;
      sVar28.data_ = (pointer)auStack_2d0;
    }
  }
  deferred.data_ = (pointer)sVar28.size_;
  auStack_2d0 = (undefined1  [8])sVar28.data_;
  bVar5 = false;
  bVar6 = false;
  __range2_1._0_4_ = 1;
  _constructIndex = this;
  insertMembersAndNets.this = this;
  __end2_1 = nonstd::span_lite::span<slang::ast::Symbol_*const,_18446744073709551615UL>::begin
                       ((span<slang::ast::Symbol_*const,_18446744073709551615UL> *)auStack_2d0);
  ppSVar14 = nonstd::span_lite::span<slang::ast::Symbol_*const,_18446744073709551615UL>::end
                       ((span<slang::ast::Symbol_*const,_18446744073709551615UL> *)auStack_2d0);
  do {
    if (__end2_1 == ppSVar14) {
      if (bVar6) {
        __begin3 = (iterator)auStack_2d0;
        __end3 = nonstd::span_lite::span<slang::ast::Symbol_*const,_18446744073709551615UL>::begin
                           ((span<slang::ast::Symbol_*const,_18446744073709551615UL> *)__begin3);
        symbol_1 = (Symbol *)
                   nonstd::span_lite::span<slang::ast::Symbol_*const,_18446744073709551615UL>::end
                             ((span<slang::ast::Symbol_*const,_18446744073709551615UL> *)__begin3);
        for (; (Symbol *)__end3 != symbol_1; __end3 = __end3 + 1) {
          member_2 = (DeferredMemberSymbol *)*__end3;
          __range3_1 = (span<const_std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_18446744073709551615UL>
                        *)Symbol::as<(anonymous_namespace)::DeferredMemberSymbol>
                                    ((Symbol *)member_2);
          if ((((DeferredMemberSymbol *)__range3_1)->node->kind == ModuleDeclaration) ||
             (((DeferredMemberSymbol *)__range3_1)->node->kind == ProgramDeclaration)) {
            syntax_12 = slang::syntax::SyntaxNode::as<slang::syntax::ModuleDeclarationSyntax>
                                  (((DeferredMemberSymbol *)__range3_1)->node);
            handleNestedDefinition(this,syntax_12);
          }
        }
      }
      if (!bVar5) {
        sVar30 = DeferredMemberData::getPortDeclarations
                           ((DeferredMemberData *)
                            &enumDecls.
                             super_flat_hash_set<const_slang::syntax::SyntaxNode_*,_std::hash<const_SyntaxNode_*>,_std::equal_to<const_SyntaxNode_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
                             .
                             super_sherwood_v3_table<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::SyntaxNode_*,_std::hash<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
                             .num_elements);
        local_870 = sVar30.size_;
        __begin3_1 = sVar30.data_;
        local_868 = (span<const_std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_18446744073709551615UL>
                     *)&__begin3_1;
        __end3_1 = nonstd::span_lite::
                   span<const_std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_18446744073709551615UL>
                   ::begin(local_868);
        local_888 = nonstd::span_lite::
                    span<const_std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_18446744073709551615UL>
                    ::end(local_868);
        for (; __end3_1 != local_888; __end3_1 = __end3_1 + 1) {
          syntax_1 = &__end3_1->first->parent;
          local_890 = __end3_1->second;
          ppSVar20 = std::get<0ul,slang::syntax::SyntaxNode_const*,slang::ast::Symbol_const*>
                               ((pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>
                                 *)&syntax_1);
          std::get<1ul,slang::syntax::SyntaxNode_const*,slang::ast::Symbol_const*>
                    ((pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*> *)
                     &syntax_1);
          if ((*ppSVar20)->kind == PortDeclaration) {
            pPVar21 = slang::syntax::SyntaxNode::as<slang::syntax::PortDeclarationSyntax>(*ppSVar20)
            ;
            local_cb0 = &pPVar21->declarators;
          }
          else {
            pDVar19 = slang::syntax::SyntaxNode::as<slang::syntax::DataDeclarationSyntax>(*ppSVar20)
            ;
            local_cb0 = &pDVar19->declarators;
          }
          cVar31 = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::begin
                             (local_cb0);
          __end4_2.index = (size_t)cVar31.list;
          cVar31 = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::end
                             (local_cb0);
          while( true ) {
            __end4_2.list = (ParentList *)cVar31.index;
            decl = (DeclaratorSyntax *)cVar31.list;
            bVar6 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::DeclaratorSyntax_*,_unsigned_long,_const_slang::syntax::DeclaratorSyntax_**,_const_slang::syntax::DeclaratorSyntax_*&>
                    ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::DeclaratorSyntax_*,_unsigned_long,_const_slang::syntax::DeclaratorSyntax_**,_const_slang::syntax::DeclaratorSyntax_*&>
                                  *)&__end4_2.index,
                                 (iterator_base<const_slang::syntax::DeclaratorSyntax_*> *)&decl);
            if (!bVar6) break;
            name._M_str = (char *)slang::syntax::
                                  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::
                                  iterator_base<const_slang::syntax::DeclaratorSyntax_*>::operator*
                                            ((iterator_base<const_slang::syntax::DeclaratorSyntax_*>
                                              *)&__end4_2.index);
            sVar32 = parsing::Token::valueText(&((DeclaratorSyntax *)name._M_str)->name);
            name._M_len = (size_t)sVar32._M_str;
            auStack_8f0 = (undefined1  [8])sVar32._M_len;
            bVar6 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_8f0);
            if (!bVar6) {
              sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)name._M_str);
              pDVar22 = addDiag(this,(DiagCode)0x990006,sourceRange);
              sVar32._M_str = (char *)name._M_len;
              sVar32._M_len = (size_t)auStack_8f0;
              Diagnostic::operator<<(pDVar22,sVar32);
              break;
            }
            iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::DeclaratorSyntax_*,_unsigned_long,_const_slang::syntax::DeclaratorSyntax_**,_const_slang::syntax::DeclaratorSyntax_*&>
            ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::DeclaratorSyntax_*,_unsigned_long,_const_slang::syntax::DeclaratorSyntax_**,_const_slang::syntax::DeclaratorSyntax_*&>
                          *)&__end4_2.index);
            cVar31.index = (size_t)__end4_2.list;
            cVar31.list = (ParentList *)decl;
          }
        }
      }
      bVar6 = nonstd::span_lite::span<slang::ast::Symbol_*const,_18446744073709551615UL>::empty
                        ((span<slang::ast::Symbol_*const,_18446744073709551615UL> *)auStack_2d0);
      if (!bVar6) {
        prev = this->firstMember;
        observedForwardDecls.
        super_flat_hash_set<std::basic_string_view<char>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char>_>,_4UL>_>
        .
        super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>_>
        .num_elements = 0;
        for (; prev != (Symbol *)0x0; prev = prev->nextInScope) {
          if (prev->kind == DeferredMember) {
            if (observedForwardDecls.
                super_flat_hash_set<std::basic_string_view<char>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char>_>,_4UL>_>
                .
                super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>_>
                .num_elements == 0) {
              this->firstMember = prev->nextInScope;
            }
            else {
              *(Symbol **)
               (observedForwardDecls.
                super_flat_hash_set<std::basic_string_view<char>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char>_>,_4UL>_>
                .
                super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>_>
                .num_elements + 0x28) = prev->nextInScope;
            }
            if (this->lastMember == prev) {
              this->lastMember = prev->nextInScope;
            }
          }
          else {
            observedForwardDecls.
            super_flat_hash_set<std::basic_string_view<char>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char>_>,_4UL>_>
            .
            super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>_>
            .num_elements = (size_t)prev;
          }
        }
      }
      SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_4UL,_ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>_>
      ::SmallSet((SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_4UL,_ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>_>
                  *)&__range2_2);
      sVar33 = DeferredMemberData::getForwardingTypedefs
                         ((DeferredMemberData *)
                          &enumDecls.
                           super_flat_hash_set<const_slang::syntax::SyntaxNode_*,_std::hash<const_SyntaxNode_*>,_std::equal_to<const_SyntaxNode_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
                           .
                           super_sherwood_v3_table<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::SyntaxNode_*,_std::hash<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
                           .num_elements);
      local_9c8 = sVar33.size_;
      __begin2_2 = sVar33.data_;
      local_9c0 = (span<const_slang::ast::ForwardingTypedefSymbol_*const,_18446744073709551615UL> *)
                  &__begin2_2;
      __end2_2 = nonstd::span_lite::
                 span<const_slang::ast::ForwardingTypedefSymbol_*const,_18446744073709551615UL>::
                 begin(local_9c0);
      ppFVar23 = nonstd::span_lite::
                 span<const_slang::ast::ForwardingTypedefSymbol_*const,_18446744073709551615UL>::end
                           (local_9c0);
      for (; __end2_2 != ppFVar23; __end2_2 = __end2_2 + 1) {
        pFVar4 = *__end2_2;
        bVar6 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                          (&(pFVar4->super_Symbol).name);
        local_d21 = 1;
        if (!bVar6) {
          pVar34 = ska::
                   flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>_>
                   ::emplace((flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>_>
                              *)&observedForwardDecls.
                                 super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
                                 .ptr,&(pFVar4->super_Symbol).name);
          it.current = (EntryPointer)pVar34.first.current;
          local_d21 = pVar34.second ^ 0xff;
        }
        if ((local_d21 & 1) == 0) {
          local_a10.current =
               (EntryPointer)
               ska::detailv3::
               sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
               ::find(&this->nameMap->
                       super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
                      ,&(pFVar4->super_Symbol).name);
          local_a18.current =
               (EntryPointer)
               ska::detailv3::
               sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
               ::end(&this->nameMap->
                      super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
                    );
          bVar6 = ska::detailv3::operator!=(&local_a10,&local_a18);
          if (((bVar6 ^ 0xffU) & 1) != 0) {
            assert::assertFailed
                      ("it != nameMap->end()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Scope.cpp"
                       ,0x442,"void slang::ast::Scope::elaborate() const");
          }
          ppVar24 = ska::detailv3::
                    sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
                    ::
                    templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
                    ::operator->(&local_a10);
          if (ppVar24->second->kind == TypeAlias) {
            ppVar24 = ska::detailv3::
                      sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
                      ::
                      templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
                      ::operator->(&local_a10);
            this_05 = Symbol::as<slang::ast::TypeAliasType>(ppVar24->second);
            TypeAliasType::checkForwardDecls(this_05);
          }
          else {
            ppVar24 = ska::detailv3::
                      sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
                      ::
                      templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
                      ::operator->(&local_a10);
            if (ppVar24->second->kind == ClassType) {
              ppVar24 = ska::detailv3::
                        sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
                        ::
                        templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
                        ::operator->(&local_a10);
              pCVar12 = Symbol::as<slang::ast::ClassType>(ppVar24->second);
              ClassType::checkForwardDecls(pCVar12);
            }
            else {
              ppVar24 = ska::detailv3::
                        sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
                        ::
                        templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
                        ::operator->(&local_a10);
              if (ppVar24->second->kind == GenericClassDef) {
                ppVar24 = ska::detailv3::
                          sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
                          ::
                          templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
                          ::operator->(&local_a10);
                this_06 = Symbol::as<slang::ast::GenericClassDefSymbol>(ppVar24->second);
                GenericClassDefSymbol::checkForwardDecls(this_06);
              }
              else {
                local_a1c = 0x37000a;
                local_a28 = (pFVar4->super_Symbol).location;
                pDVar22 = addDiag(this,(DiagCode)0x37000a,local_a28);
                psVar1 = &(pFVar4->super_Symbol).name;
                at = (Symbol *)psVar1->_M_len;
                pcStack_a30 = (pFVar4->super_Symbol).name._M_str;
                Diagnostic::operator<<(pDVar22,*psVar1);
              }
            }
          }
        }
      }
      if (this->thisSym->kind == StatementBlock) {
        local_a40 = (Symbol *)0x0;
        this_07 = Symbol::as<slang::ast::StatementBlockSymbol>(this->thisSym);
        local_a60.at = &local_a40;
        local_a60.this = this;
        function_ref<void(slang::ast::Symbol_const&)>::
        function_ref<slang::ast::Scope::elaborate()const::__4>
                  ((function_ref<void(slang::ast::Symbol_const&)> *)&local_a50,&local_a60,
                   (enable_if_t<_std::is_same<std::remove_cv_t<std::remove_reference_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Kuree[P]hgdb_rtl_extern_slang_source_ast_Scope_cpp:1106:64)>_>,_function_ref<void_(const_Symbol_&)>_>::value>
                    *)0x0);
        StatementBlockSymbol::elaborateVariables(this_07,local_a50);
      }
      if (this->deferredMemberIndex == Invalid) {
        if ((this->thisSym->kind == InstanceBody) && (bVar6 = TimeTrace::isEnabled(), bVar6)) {
          TimeTrace::endTrace();
        }
        SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_4UL,_ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>_>
        ::~SmallSet((SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_4UL,_ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>_>
                     *)&__range2_2);
        SmallSet<const_slang::syntax::SyntaxNode_*,_8UL,_ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
        ::~SmallSet((SmallSet<const_slang::syntax::SyntaxNode_*,_8UL,_ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
                     *)local_148);
        DeferredMemberData::~DeferredMemberData
                  ((DeferredMemberData *)
                   &enumDecls.
                    super_flat_hash_set<const_slang::syntax::SyntaxNode_*,_std::hash<const_SyntaxNode_*>,_std::equal_to<const_SyntaxNode_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
                    .
                    super_sherwood_v3_table<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::SyntaxNode_*,_std::hash<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
                    .num_elements);
        return;
      }
      assert::assertFailed
                ("deferredMemberIndex == DeferredMemberIndex::Invalid",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Scope.cpp"
                 ,0x458,"void slang::ast::Scope::elaborate() const");
    }
    context_1.assertionInstance = (AssertionInstanceDetails *)*__end2_1;
    LVar29 = LookupLocation::before((Symbol *)context_1.assertionInstance);
    local_388 = LVar29.scope;
    local_380 = LVar29.index;
    local_378 = local_388;
    local_370 = local_380;
    bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&member_1,None);
    lookupLocation.index = local_370;
    lookupLocation.scope = local_378;
    lookupLocation._12_4_ = 0;
    ASTContext::ASTContext
              ((ASTContext *)local_368,this,lookupLocation,(bitmask<slang::ast::ASTFlags>)member_1);
    pDVar15 = Symbol::as<(anonymous_namespace)::DeferredMemberSymbol>
                        ((Symbol *)context_1.assertionInstance);
    SVar2 = pDVar15->node->kind;
    if (SVar2 == AnsiPortList) {
LAB_00439d41:
      SmallVector<const_slang::ast::Symbol_*,_5UL>::SmallVector
                ((SmallVector<const_slang::ast::Symbol_*,_5UL> *)(implicitMembers.stackBase + 0x28))
      ;
      SmallVector<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_4UL>::SmallVector
                ((SmallVector<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_4UL> *)
                 local_5b0);
      this_01 = (PortSymbol *)
                slang::syntax::SyntaxNode::as<slang::syntax::PortListSyntax>(pDVar15->node);
      sVar30 = DeferredMemberData::getPortDeclarations
                         ((DeferredMemberData *)
                          &enumDecls.
                           super_flat_hash_set<const_slang::syntax::SyntaxNode_*,_std::hash<const_SyntaxNode_*>,_std::equal_to<const_SyntaxNode_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
                           .
                           super_sherwood_v3_table<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::SyntaxNode_*,_std::hash<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
                           .num_elements);
      local_5b8 = sVar30.size_;
      __range4_1 = (SmallVector<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_4UL> *)
                   sVar30.data_;
      sVar30.size_._7_1_ = in_stack_fffffffffffff257;
      sVar30._0_15_ = in_stack_fffffffffffff248;
      PortSymbol::fromSyntax
                (this_01,(PortListSyntax *)this,(Scope *)(implicitMembers.stackBase + 0x28),
                 (SmallVectorBase<const_slang::ast::Symbol_*> *)local_5b0,
                 (SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *)
                 __range4_1,sVar30);
      const::$_1::operator()
                ((__1 *)&insertMembersAndNets,
                 (SmallVector<const_slang::ast::Symbol_*,_5UL> *)(implicitMembers.stackBase + 0x28),
                 (Symbol *)context_1.assertionInstance);
      __begin4_1 = (iterator)local_5b0;
      __end4_1 = SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>::
                 begin((SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>
                        *)__begin4_1);
      local_5d8 = SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>::end
                            ((SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>
                              *)__begin4_1);
      for (; __end4_1 != local_5d8; __end4_1 = __end4_1 + 1) {
        implicitMember = (type *)__end4_1->first;
        pSStack_5e0 = __end4_1->second;
        insertionPoint =
             std::get<0ul,slang::ast::Symbol*,slang::ast::Symbol_const*>
                       ((pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*> *)&implicitMember);
        local_5f8 = std::get<1ul,slang::ast::Symbol*,slang::ast::Symbol_const*>
                              ((pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*> *)
                               &implicitMember);
        insertMember(this,*insertionPoint,*local_5f8,true,false);
      }
      this_02 = asSymbol(this);
      pIVar16 = Symbol::as<slang::ast::InstanceBodySymbol>(this_02);
      symbols.stackBase._24_4_ =
           SmallVectorBase<const_slang::ast::Symbol_*>::copy
                     ((SmallVectorBase<const_slang::ast::Symbol_*> *)
                      (implicitMembers.stackBase + 0x28),(EVP_PKEY_CTX *)this->compilation,src);
      symbols.stackBase._28_4_ = extraout_var;
      nonstd::span_lite::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>::
      span<const_slang::ast::Symbol_*,_18446744073709551615UL,_0>
                (&local_608,
                 (span<const_slang::ast::Symbol_*,_18446744073709551615UL> *)
                 (symbols.stackBase + 0x18));
      InstanceBodySymbol::setPorts(pIVar16,local_608);
      bVar5 = true;
      SmallVector<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_4UL>::~SmallVector
                ((SmallVector<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_4UL> *)
                 local_5b0);
      SmallVector<const_slang::ast::Symbol_*,_5UL>::~SmallVector
                ((SmallVector<const_slang::ast::Symbol_*,_5UL> *)(implicitMembers.stackBase + 0x28))
      ;
    }
    else if (SVar2 == BindDirective) {
      syntax_09 = slang::syntax::SyntaxNode::as<slang::syntax::BindDirectiveSyntax>(pDVar15->node);
      InstanceSymbol::fromBindDirective(this,syntax_09);
    }
    else if (SVar2 == CaseGenerate) {
      SmallVector<slang::ast::GenerateBlockSymbol_*,_5UL>::SmallVector
                ((SmallVector<slang::ast::GenerateBlockSymbol_*,_5UL> *)(ports.stackBase + 0x18));
      pCVar3 = this->compilation;
      syntax_04 = slang::syntax::SyntaxNode::as<slang::syntax::CaseGenerateSyntax>(pDVar15->node);
      GenerateBlockSymbol::fromSyntax
                (pCVar3,syntax_04,(ASTContext *)local_368,(uint32_t)__range2_1,true,
                 (SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *)(ports.stackBase + 0x18));
      __range2_1._0_4_ = (uint32_t)__range2_1 + 1;
      const::$_1::operator()
                ((__1 *)&insertMembersAndNets,
                 (SmallVector<slang::ast::GenerateBlockSymbol_*,_5UL> *)(ports.stackBase + 0x18),
                 (Symbol *)context_1.assertionInstance);
      SmallVector<slang::ast::GenerateBlockSymbol_*,_5UL>::~SmallVector
                ((SmallVector<slang::ast::GenerateBlockSymbol_*,_5UL> *)(ports.stackBase + 0x18));
    }
    else if (SVar2 == ClockingItem) {
      SmallVector<const_slang::ast::ClockVarSymbol_*,_5UL>::SmallVector
                ((SmallVector<const_slang::ast::ClockVarSymbol_*,_5UL> *)&expr);
      syntax_10 = slang::syntax::SyntaxNode::as<slang::syntax::ClockingItemSyntax>(pDVar15->node);
      ClockVarSymbol::fromSyntax
                (this,syntax_10,(SmallVectorBase<const_slang::ast::ClockVarSymbol_*> *)&expr);
      const::$_1::operator()
                ((__1 *)&insertMembersAndNets,
                 (SmallVector<const_slang::ast::ClockVarSymbol_*,_5UL> *)&expr,
                 (Symbol *)context_1.assertionInstance);
      SmallVector<const_slang::ast::ClockVarSymbol_*,_5UL>::~SmallVector
                ((SmallVector<const_slang::ast::ClockVarSymbol_*,_5UL> *)&expr);
    }
    else if (SVar2 == ContinuousAssign) {
      SmallVector<const_slang::ast::Symbol_*,_5UL>::SmallVector
                ((SmallVector<const_slang::ast::Symbol_*,_5UL> *)(implicitNets_2.stackBase + 0x18));
      SmallVector<const_slang::ast::Symbol_*,_5UL>::SmallVector
                ((SmallVector<const_slang::ast::Symbol_*,_5UL> *)(results.stackBase + 0x18));
      pCVar3 = this->compilation;
      syntax_07 = slang::syntax::SyntaxNode::as<slang::syntax::ContinuousAssignSyntax>
                            (pDVar15->node);
      ContinuousAssignSymbol::fromSyntax
                (pCVar3,syntax_07,(ASTContext *)local_368,
                 (SmallVectorBase<const_slang::ast::Symbol_*> *)(implicitNets_2.stackBase + 0x18),
                 (SmallVectorBase<const_slang::ast::Symbol_*> *)(results.stackBase + 0x18));
      const::$_0::operator()
                ((__0 *)&constructIndex,
                 (SmallVector<const_slang::ast::Symbol_*,_5UL> *)(implicitNets_2.stackBase + 0x18),
                 (SmallVector<const_slang::ast::Symbol_*,_5UL> *)(results.stackBase + 0x18),
                 (Symbol *)context_1.assertionInstance);
      SmallVector<const_slang::ast::Symbol_*,_5UL>::~SmallVector
                ((SmallVector<const_slang::ast::Symbol_*,_5UL> *)(results.stackBase + 0x18));
      SmallVector<const_slang::ast::Symbol_*,_5UL>::~SmallVector
                ((SmallVector<const_slang::ast::Symbol_*,_5UL> *)(implicitNets_2.stackBase + 0x18));
    }
    else if (SVar2 == DataDeclaration) {
      SmallVector<const_slang::ast::Symbol_*,_5UL>::SmallVector
                ((SmallVector<const_slang::ast::Symbol_*,_5UL> *)local_768);
      pDVar19 = slang::syntax::SyntaxNode::as<slang::syntax::DataDeclarationSyntax>(pDVar15->node);
      tryFixupInstances(this,pDVar19,(ASTContext *)local_368,
                        (SmallVectorBase<const_slang::ast::Symbol_*> *)local_768);
      const::$_1::operator()
                ((__1 *)&insertMembersAndNets,
                 (SmallVector<const_slang::ast::Symbol_*,_5UL> *)local_768,
                 (Symbol *)context_1.assertionInstance);
      SmallVector<const_slang::ast::Symbol_*,_5UL>::~SmallVector
                ((SmallVector<const_slang::ast::Symbol_*,_5UL> *)local_768);
    }
    else if (SVar2 == DefaultClockingReference) {
      pCVar3 = this->compilation;
      syntax_11 = slang::syntax::SyntaxNode::as<slang::syntax::DefaultClockingReferenceSyntax>
                            (pDVar15->node);
      Compilation::noteDefaultClocking(pCVar3,(ASTContext *)local_368,syntax_11);
    }
    else if (SVar2 == DefaultDisableDeclaration) {
      pDVar17 = slang::syntax::SyntaxNode::as<slang::syntax::DefaultDisableDeclarationSyntax>
                          (pDVar15->node);
      pEVar18 = not_null<slang::syntax::ExpressionSyntax_*>::operator*(&pDVar17->expr);
      bitmask<slang::ast::ASTFlags>::bitmask
                ((bitmask<slang::ast::ASTFlags> *)(instances_2.stackBase + 0x18),None);
      iVar8 = Expression::bind((int)pEVar18,(sockaddr *)local_368,instances_2.stackBase._24_4_);
      expr_00 = (Expression *)CONCAT44(extraout_var_00,iVar8);
      this_03 = not_null<const_slang::ast::Type_*>::operator->(&expr_00->type);
      bVar7 = Type::isVoid(this_03);
      if (!bVar7) {
        ASTContext::requireBooleanConvertible((ASTContext *)local_368,expr_00);
      }
      Compilation::noteDefaultDisable(this->compilation,this,expr_00);
    }
    else if (SVar2 == GenerateBlock) {
      syntax_06 = slang::syntax::SyntaxNode::as<slang::syntax::GenerateBlockSyntax>(pDVar15->node);
      member_02 = GenerateBlockSymbol::fromSyntax(this,syntax_06,(uint32_t)__range2_1);
      insertMember(this,&member_02->super_Symbol,(Symbol *)context_1.assertionInstance,true,true);
      __range2_1._0_4_ = (uint32_t)__range2_1 + 1;
    }
    else if (SVar2 == HierarchyInstantiation) {
      SmallVector<const_slang::ast::Symbol_*,_5UL>::SmallVector
                ((SmallVector<const_slang::ast::Symbol_*,_5UL> *)(implicitNets.stackBase + 0x18));
      SmallVector<const_slang::ast::Symbol_*,_5UL>::SmallVector
                ((SmallVector<const_slang::ast::Symbol_*,_5UL> *)(instances_1.stackBase + 0x18));
      pCVar3 = this->compilation;
      syntax_01 = slang::syntax::SyntaxNode::as<slang::syntax::HierarchyInstantiationSyntax>
                            (pDVar15->node);
      InstanceSymbol::fromSyntax
                (pCVar3,syntax_01,(ASTContext *)local_368,
                 (SmallVectorBase<const_slang::ast::Symbol_*> *)(implicitNets.stackBase + 0x18),
                 (SmallVectorBase<const_slang::ast::Symbol_*> *)(instances_1.stackBase + 0x18));
      const::$_0::operator()
                ((__0 *)&constructIndex,
                 (SmallVector<const_slang::ast::Symbol_*,_5UL> *)(implicitNets.stackBase + 0x18),
                 (SmallVector<const_slang::ast::Symbol_*,_5UL> *)(instances_1.stackBase + 0x18),
                 (Symbol *)context_1.assertionInstance);
      SmallVector<const_slang::ast::Symbol_*,_5UL>::~SmallVector
                ((SmallVector<const_slang::ast::Symbol_*,_5UL> *)(instances_1.stackBase + 0x18));
      SmallVector<const_slang::ast::Symbol_*,_5UL>::~SmallVector
                ((SmallVector<const_slang::ast::Symbol_*,_5UL> *)(implicitNets.stackBase + 0x18));
    }
    else if (SVar2 == IfGenerate) {
      SmallVector<slang::ast::GenerateBlockSymbol_*,_5UL>::SmallVector
                ((SmallVector<slang::ast::GenerateBlockSymbol_*,_5UL> *)(blocks_1.stackBase + 0x18))
      ;
      pCVar3 = this->compilation;
      syntax_03 = slang::syntax::SyntaxNode::as<slang::syntax::IfGenerateSyntax>(pDVar15->node);
      GenerateBlockSymbol::fromSyntax
                (pCVar3,syntax_03,(ASTContext *)local_368,(uint32_t)__range2_1,true,
                 (SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *)(blocks_1.stackBase + 0x18));
      __range2_1._0_4_ = (uint32_t)__range2_1 + 1;
      const::$_1::operator()
                ((__1 *)&insertMembersAndNets,
                 (SmallVector<slang::ast::GenerateBlockSymbol_*,_5UL> *)(blocks_1.stackBase + 0x18),
                 (Symbol *)context_1.assertionInstance);
      SmallVector<slang::ast::GenerateBlockSymbol_*,_5UL>::~SmallVector
                ((SmallVector<slang::ast::GenerateBlockSymbol_*,_5UL> *)(blocks_1.stackBase + 0x18))
      ;
    }
    else if (SVar2 == LoopGenerate) {
      pCVar3 = this->compilation;
      syntax_05 = slang::syntax::SyntaxNode::as<slang::syntax::LoopGenerateSyntax>(pDVar15->node);
      scopeIndex = Symbol::getIndex((Symbol *)context_1.assertionInstance);
      member_01 = GenerateBlockArraySymbol::fromSyntax
                            (pCVar3,syntax_05,scopeIndex,(ASTContext *)local_368,
                             (uint32_t)__range2_1);
      insertMember(this,&member_01->super_Symbol,(Symbol *)context_1.assertionInstance,true,true);
      __range2_1._0_4_ = (uint32_t)__range2_1 + 1;
    }
    else if (SVar2 == ModportDeclaration) {
      SmallVector<const_slang::ast::ModportSymbol_*,_5UL>::SmallVector
                ((SmallVector<const_slang::ast::ModportSymbol_*,_5UL> *)(vars.stackBase + 0x18));
      syntax_08 = slang::syntax::SyntaxNode::as<slang::syntax::ModportDeclarationSyntax>
                            (pDVar15->node);
      ModportSymbol::fromSyntax
                ((ASTContext *)local_368,syntax_08,
                 (SmallVectorBase<const_slang::ast::ModportSymbol_*> *)(vars.stackBase + 0x18));
      const::$_1::operator()
                ((__1 *)&insertMembersAndNets,
                 (SmallVector<const_slang::ast::ModportSymbol_*,_5UL> *)(vars.stackBase + 0x18),
                 (Symbol *)context_1.assertionInstance);
      SmallVector<const_slang::ast::ModportSymbol_*,_5UL>::~SmallVector
                ((SmallVector<const_slang::ast::ModportSymbol_*,_5UL> *)(vars.stackBase + 0x18));
    }
    else if (SVar2 == ModuleDeclaration) {
LAB_0043a3a6:
      bVar6 = true;
    }
    else {
      if (SVar2 == NonAnsiPortList) goto LAB_00439d41;
      if (SVar2 != PortDeclaration) {
        if (SVar2 != PrimitiveInstantiation) {
          if (SVar2 != ProgramDeclaration) {
            __range3._7_1_ = 1;
            this_04 = (logic_error *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_808,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Scope.cpp"
                       ,&local_809);
            std::operator+(&local_7e8,&local_808,":");
            std::__cxx11::to_string(&local_830,0x400);
            std::operator+(&local_7c8,&local_7e8,&local_830);
            std::operator+(&local_7a8,&local_7c8,": ");
            std::operator+(&local_788,&local_7a8,"Default case should be unreachable!");
            std::logic_error::logic_error(this_04,(string *)&local_788);
            __range3._7_1_ = 0;
            __cxa_throw(this_04,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          goto LAB_0043a3a6;
        }
        SmallVector<const_slang::ast::Symbol_*,_5UL>::SmallVector
                  ((SmallVector<const_slang::ast::Symbol_*,_5UL> *)(implicitNets_1.stackBase + 0x18)
                  );
        SmallVector<const_slang::ast::Symbol_*,_5UL>::SmallVector
                  ((SmallVector<const_slang::ast::Symbol_*,_5UL> *)(blocks.stackBase + 0x18));
        syntax_02 = slang::syntax::SyntaxNode::as<slang::syntax::PrimitiveInstantiationSyntax>
                              (pDVar15->node);
        PrimitiveInstanceSymbol::fromSyntax
                  (syntax_02,(ASTContext *)local_368,
                   (SmallVectorBase<const_slang::ast::Symbol_*> *)(implicitNets_1.stackBase + 0x18),
                   (SmallVectorBase<const_slang::ast::Symbol_*> *)(blocks.stackBase + 0x18));
        const::$_0::operator()
                  ((__0 *)&constructIndex,
                   (SmallVector<const_slang::ast::Symbol_*,_5UL> *)(implicitNets_1.stackBase + 0x18)
                   ,(SmallVector<const_slang::ast::Symbol_*,_5UL> *)(blocks.stackBase + 0x18),
                   (Symbol *)context_1.assertionInstance);
        SmallVector<const_slang::ast::Symbol_*,_5UL>::~SmallVector
                  ((SmallVector<const_slang::ast::Symbol_*,_5UL> *)(blocks.stackBase + 0x18));
        SmallVector<const_slang::ast::Symbol_*,_5UL>::~SmallVector
                  ((SmallVector<const_slang::ast::Symbol_*,_5UL> *)(implicitNets_1.stackBase + 0x18)
                  );
      }
    }
    __end2_1 = __end2_1 + 1;
  } while( true );
}

Assistant:

void Scope::elaborate() const {
    if (thisSym->kind == SymbolKind::InstanceBody && TimeTrace::isEnabled()) {
        TimeTrace::beginTrace("elaborate scope"sv, [&] {
            std::string buffer;
            thisSym->getHierarchicalPath(buffer);
            return buffer;
        });
    }

    ASSERT(deferredMemberIndex != DeferredMemberIndex::Invalid);
    auto deferredData = compilation.getOrAddDeferredData(deferredMemberIndex);
    deferredMemberIndex = DeferredMemberIndex::Invalid;

    SmallSet<const SyntaxNode*, 8> enumDecls;
    for (const auto& pair : deferredData.getTransparentTypes()) {
        auto insertAt = pair.first;
        auto dt = pair.second->getDeclaredType();

        const Type* type = &dt->getType();
        while (type->isPackedArray())
            type = type->getArrayElementType();

        if (type->kind == SymbolKind::EnumType) {
            if (!type->getSyntax() || enumDecls.insert(type->getSyntax()).second) {
                for (const auto& value : type->as<EnumType>().values()) {
                    auto wrapped = compilation.emplace<TransparentMemberSymbol>(value);
                    insertMember(wrapped, insertAt, true, false);
                    insertAt = wrapped;
                }
            }
        }
        else {
            // If there was an error with the enum definition, we still want to
            // add all of the members into this scope so that we don't get
            // further errors reported.
            auto syntax = dt->getTypeSyntax();
            ASSERT(syntax);
            ASSERT(type->kind == SymbolKind::ErrorType);

            SmallVector<const Symbol*> members;
            ASTContext context(*this, LookupLocation::max);
            EnumType::createDefaultMembers(context, syntax->as<EnumTypeSyntax>(), members);

            for (auto member : members) {
                insertMember(member, insertAt, true, false);
                insertAt = member;
            }
        }
    }

    auto deferred = deferredData.getMembers();

    if (thisSym->kind == SymbolKind::ClassType) {
        // If this is a class type being elaborated, let it inherit members from parent classes.
        thisSym->as<ClassType>().inheritMembers(
            [this](const Symbol& member) { insertMember(&member, nullptr, true, true); });
    }
    else if (thisSym->kind == SymbolKind::InstanceBody &&
             thisSym->as<InstanceBodySymbol>().getDefinition().definitionKind ==
                 DefinitionKind::Interface) {
        // Allow the interface to implicitly declare extern methods for
        // exported subroutines that are only declared in modports.
        handleExportedMethods(deferred);
    }

    auto insertMembers = [this](auto& members, const Symbol* at) {
        // When we originally inserted the DeferredMemberSymbol we made room
        // in the index space for these new members. Back the index up by
        // the number of new members to make sure we insert in order.
        ASSERT(at);
        at->indexInScope -= (uint32_t)members.size();
        for (auto member : members) {
            insertMember(member, at, true, true);
            at = member;
        }
    };

    auto insertMembersAndNets = [this](auto& members, auto& implicitNets, const Symbol* at) {
        ASSERT(at);
        at->indexInScope -= (uint32_t)members.size() + 1;
        for (auto net : implicitNets) {
            insertMember(net, at, true, false);
            at = net;
        }

        at->indexInScope += 1;
        for (auto member : members) {
            insertMember(member, at, true, true);
            at = member;
        }
    };

    // Go through deferred instances and elaborate them now.
    bool usedPorts = false;
    bool hasNestedDefs = false;
    uint32_t constructIndex = 1;

    for (auto symbol : deferred) {
        ASTContext context(*this, LookupLocation::before(*symbol));
        auto& member = symbol->as<DeferredMemberSymbol>();

        switch (member.node.kind) {
            case SyntaxKind::HierarchyInstantiation: {
                SmallVector<const Symbol*> instances;
                SmallVector<const Symbol*> implicitNets;
                InstanceSymbol::fromSyntax(compilation,
                                           member.node.as<HierarchyInstantiationSyntax>(), context,
                                           instances, implicitNets);
                insertMembersAndNets(instances, implicitNets, symbol);
                break;
            }
            case SyntaxKind::PrimitiveInstantiation: {
                SmallVector<const Symbol*> instances;
                SmallVector<const Symbol*> implicitNets;
                PrimitiveInstanceSymbol::fromSyntax(member.node.as<PrimitiveInstantiationSyntax>(),
                                                    context, instances, implicitNets);
                insertMembersAndNets(instances, implicitNets, symbol);
                break;
            }
            case SyntaxKind::IfGenerate: {
                SmallVector<GenerateBlockSymbol*> blocks;
                GenerateBlockSymbol::fromSyntax(compilation, member.node.as<IfGenerateSyntax>(),
                                                context, constructIndex, true, blocks);
                constructIndex++;
                insertMembers(blocks, symbol);
                break;
            }
            case SyntaxKind::CaseGenerate: {
                SmallVector<GenerateBlockSymbol*> blocks;
                GenerateBlockSymbol::fromSyntax(compilation, member.node.as<CaseGenerateSyntax>(),
                                                context, constructIndex, true, blocks);
                constructIndex++;
                insertMembers(blocks, symbol);
                break;
            }
            case SyntaxKind::LoopGenerate:
                insertMember(&GenerateBlockArraySymbol::fromSyntax(
                                 compilation, member.node.as<LoopGenerateSyntax>(),
                                 symbol->getIndex(), context, constructIndex),
                             symbol, true, true);
                constructIndex++;
                break;
            case SyntaxKind::GenerateBlock:
                // This case is invalid according to the spec but the parser only issues a warning
                // since some existing code does this anyway.
                insertMember(&GenerateBlockSymbol::fromSyntax(
                                 *this, member.node.as<GenerateBlockSyntax>(), constructIndex),
                             symbol, true, true);
                constructIndex++;
                break;
            case SyntaxKind::AnsiPortList:
            case SyntaxKind::NonAnsiPortList: {
                SmallVector<const Symbol*> ports;
                SmallVector<std::pair<Symbol*, const Symbol*>, 4> implicitMembers;
                PortSymbol::fromSyntax(member.node.as<PortListSyntax>(), *this, ports,
                                       implicitMembers, deferredData.getPortDeclarations());
                insertMembers(ports, symbol);

                for (auto [implicitMember, insertionPoint] : implicitMembers)
                    insertMember(implicitMember, insertionPoint, true, false);

                // Let the instance know its list of ports. This is kind of annoying because it
                // inverts the dependency tree but it's better than giving all symbols a virtual
                // method just for this.
                asSymbol().as<InstanceBodySymbol>().setPorts(ports.copy(compilation));
                usedPorts = true;
                break;
            }
            case SyntaxKind::ContinuousAssign: {
                SmallVector<const Symbol*> symbols;
                SmallVector<const Symbol*> implicitNets;
                ContinuousAssignSymbol::fromSyntax(compilation,
                                                   member.node.as<ContinuousAssignSyntax>(),
                                                   context, symbols, implicitNets);
                insertMembersAndNets(symbols, implicitNets, symbol);
                break;
            }
            case SyntaxKind::ModportDeclaration: {
                SmallVector<const ModportSymbol*> results;
                ModportSymbol::fromSyntax(context, member.node.as<ModportDeclarationSyntax>(),
                                          results);
                insertMembers(results, symbol);
                break;
            }
            case SyntaxKind::BindDirective:
                InstanceSymbol::fromBindDirective(*this, member.node.as<BindDirectiveSyntax>());
                break;
            case SyntaxKind::ClockingItem: {
                SmallVector<const ClockVarSymbol*> vars;
                ClockVarSymbol::fromSyntax(*this, member.node.as<ClockingItemSyntax>(), vars);
                insertMembers(vars, symbol);
                break;
            }
            case SyntaxKind::DefaultClockingReference: {
                // No symbol to create here; instead, try to look up the clocking block
                // and register it as a default.
                compilation.noteDefaultClocking(context,
                                                member.node.as<DefaultClockingReferenceSyntax>());
                break;
            }
            case SyntaxKind::DefaultDisableDeclaration: {
                // No symbol to create here; instead, bind the expression and hand it
                // off to the compilation for tracking.
                auto& expr = Expression::bind(
                    *member.node.as<DefaultDisableDeclarationSyntax>().expr, context);

                if (!expr.type->isVoid())
                    context.requireBooleanConvertible(expr);

                compilation.noteDefaultDisable(*this, expr);
                break;
            }
            case SyntaxKind::PortDeclaration:
                // Nothing to do here, handled by port creation.
                break;
            case SyntaxKind::DataDeclaration: {
                SmallVector<const Symbol*> instances;
                tryFixupInstances(member.node.as<DataDeclarationSyntax>(), context, instances);
                insertMembers(instances, symbol);
                break;
            }
            case SyntaxKind::ModuleDeclaration:
            case SyntaxKind::ProgramDeclaration:
                // These have to wait until we've seen all instantiations.
                hasNestedDefs = true;
                break;
            default:
                ASSUME_UNREACHABLE;
        }
    }

    // If there are nested definitions, go back through and find ones that
    // need to be implicitly instantiated.
    if (hasNestedDefs) {
        for (auto symbol : deferred) {
            auto& member = symbol->as<DeferredMemberSymbol>();
            if (member.node.kind == SyntaxKind::ModuleDeclaration ||
                member.node.kind == SyntaxKind::ProgramDeclaration) {
                handleNestedDefinition(member.node.as<ModuleDeclarationSyntax>());
            }
        }
    }

    // Issue an error if port I/Os were declared but the module doesn't have a port list.
    if (!usedPorts) {
        for (auto [syntax, symbol] : deferredData.getPortDeclarations()) {
            auto& declarators = syntax->kind == SyntaxKind::PortDeclaration
                                    ? syntax->as<PortDeclarationSyntax>().declarators
                                    : syntax->as<DataDeclarationSyntax>().declarators;
            for (auto decl : declarators) {
                // We'll report an error for just the first decl in each syntax entry,
                // because it should be clear to the user that there aren't any ports
                // at all in the module header.
                auto name = decl->name.valueText();
                if (!name.empty()) {
                    addDiag(diag::UnusedPortDecl, decl->sourceRange()) << name;
                    break;
                }
            }
        }
    }

    // Finally unlink any deferred members we had; we no longer need them.
    if (!deferred.empty()) {
        const Symbol* symbol = firstMember;
        const Symbol* prev = nullptr;

        while (symbol) {
            if (symbol->kind == SymbolKind::DeferredMember) {
                if (prev)
                    prev->nextInScope = symbol->nextInScope;
                else
                    firstMember = symbol->nextInScope;

                if (lastMember == symbol)
                    lastMember = symbol->nextInScope;
            }
            else {
                prev = symbol;
            }
            symbol = symbol->nextInScope;
        }
    }

    SmallSet<string_view, 4> observedForwardDecls;
    for (auto symbol : deferredData.getForwardingTypedefs()) {
        // Ignore duplicate entries.
        if (symbol->name.empty() || !observedForwardDecls.emplace(symbol->name).second)
            continue;

        // Try to do a lookup by name; if the program is well-formed we'll find the
        // corresponding full typedef. If we don't, issue an error.
        auto it = nameMap->find(symbol->name);
        ASSERT(it != nameMap->end());

        if (it->second->kind == SymbolKind::TypeAlias)
            it->second->as<TypeAliasType>().checkForwardDecls();
        else if (it->second->kind == SymbolKind::ClassType)
            it->second->as<ClassType>().checkForwardDecls();
        else if (it->second->kind == SymbolKind::GenericClassDef)
            it->second->as<GenericClassDefSymbol>().checkForwardDecls();
        else
            addDiag(diag::UnresolvedForwardTypedef, symbol->location) << symbol->name;
    }

    // Allow statement blocks containing variables to include them in their member
    // list before allowing anyone else to access the contained statements.
    if (thisSym->kind == SymbolKind::StatementBlock) {
        const Symbol* at = nullptr;
        thisSym->as<StatementBlockSymbol>().elaborateVariables([this, &at](const Symbol& member) {
            insertMember(&member, at, true, false);
            at = &member;
        });
    }

    ASSERT(deferredMemberIndex == DeferredMemberIndex::Invalid);
    if (thisSym->kind == SymbolKind::InstanceBody && TimeTrace::isEnabled())
        TimeTrace::endTrace();
}